

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

bool Data649::loadArchive(char *fname,Issues *issues)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  vector<int,_std::allocator<int>_> arr;
  Issue issue;
  string line;
  istringstream iss;
  ifstream fin;
  int local_44c;
  int *local_448;
  iterator iStack_440;
  int *local_438;
  Issue local_428;
  undefined1 *local_400;
  undefined8 local_3f8;
  undefined1 local_3f0;
  undefined7 uStack_3ef;
  Draw local_3dc;
  Issues *local_3c0;
  long local_3b8 [4];
  uint auStack_398 [22];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::_M_erase_at_end
            (issues,(issues->super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>).
                    _M_impl.super__Vector_impl_data._M_start);
  std::ifstream::ifstream((istream *)local_238,fname,_S_in);
  bVar3 = false;
  if (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    local_44c = 0;
    local_3c0 = issues;
    do {
      local_400 = &local_3f0;
      local_3f8 = 0;
      local_3f0 = 0;
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_400,cVar2);
      iVar5 = 3;
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
        local_448 = (int *)0x0;
        iStack_440._M_current = (int *)0x0;
        local_438 = (int *)0x0;
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3b8,(string *)&local_400,_S_in);
        do {
          uVar1 = *(uint *)((long)auStack_398 + *(long *)(local_3b8[0] + -0x18));
          if ((uVar1 & 2) != 0) break;
          std::istream::operator>>((istream *)local_3b8,&local_428.id);
          if (iStack_440._M_current == local_438) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_448,iStack_440,&local_428.id);
          }
          else {
            *iStack_440._M_current = local_428.id;
            iStack_440._M_current = iStack_440._M_current + 1;
          }
        } while ((uVar1 & 2) == 0);
        iVar5 = (int)((ulong)((long)iStack_440._M_current - (long)local_448) >> 2);
        uVar1 = iVar5 - 8U >> 1;
        if (((uVar1 | (uint)((iVar5 - 8U & 1) != 0) << 0x1f) < 10) &&
           ((0x249U >> (uVar1 & 0x1f) & 1) != 0)) {
          local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl.
          super__Vector_impl_data._M_finish = (Draw *)0x0;
          local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (Draw *)0x0;
          local_428.year = *local_448;
          local_428.idYear = local_448[1];
          local_428.id = local_44c;
          if (7 < iVar5) {
            uVar1 = (iVar5 + -2) / 6;
            if ((int)uVar1 < 2) {
              uVar1 = 1;
            }
            lVar4 = 0x1c;
            uVar6 = 0;
            do {
              local_3dc.id = (int)uVar6;
              local_3dc.nums._M_elems[0] = *(int *)((long)local_448 + lVar4 + -0x14);
              local_3dc.nums._M_elems[1] = *(int *)((long)local_448 + lVar4 + -0x10);
              local_3dc.nums._M_elems[2] = *(int *)((long)local_448 + lVar4 + -0xc);
              local_3dc.nums._M_elems[3] = *(int *)((long)local_448 + lVar4 + -8);
              local_3dc.nums._M_elems[4] = *(int *)((long)local_448 + lVar4 + -4);
              local_3dc.nums._M_elems[5] = *(int *)((long)local_448 + lVar4);
              if (local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>::
                _M_realloc_insert<Data649::Draw>
                          (&local_428.draws,
                           (iterator)
                           local_428.draws.
                           super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl
                           .super__Vector_impl_data._M_finish,&local_3dc);
              }
              else {
                *(ulong *)(((local_428.draws.
                             super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                             _M_impl.super__Vector_impl_data._M_finish)->nums)._M_elems + 2) =
                     CONCAT44(local_3dc.nums._M_elems[3],local_3dc.nums._M_elems[2]);
                *(ulong *)(((local_428.draws.
                             super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                             _M_impl.super__Vector_impl_data._M_finish)->nums)._M_elems + 4) =
                     CONCAT44(local_3dc.nums._M_elems[5],local_3dc.nums._M_elems[4]);
                (local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->id = local_3dc.id;
                ((local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->nums)._M_elems[0] =
                     local_3dc.nums._M_elems[0];
                *(ulong *)(((local_428.draws.
                             super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                             _M_impl.super__Vector_impl_data._M_finish)->nums)._M_elems + 1) =
                     CONCAT44(local_3dc.nums._M_elems[2],local_3dc.nums._M_elems[1]);
                local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_428.draws.
                     super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              uVar6 = uVar6 + 1;
              lVar4 = lVar4 + 0x18;
            } while (uVar1 != uVar6);
          }
          std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::emplace_back<Data649::Issue>
                    (local_3c0,&local_428);
          if (local_428.draws.super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_428.draws.
                            super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_428.draws.
                                  super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_428.draws.
                                  super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_44c = local_44c + 1;
          iVar5 = 0;
        }
        else {
          fprintf(_stderr,"Unexpected number of integers in archive line: %d\n");
          iVar5 = 1;
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
        if (local_448 != (int *)0x0) {
          operator_delete(local_448,(long)local_438 - (long)local_448);
        }
      }
      if (local_400 != &local_3f0) {
        operator_delete(local_400,CONCAT71(uStack_3ef,local_3f0) + 1);
      }
    } while (iVar5 == 0);
    if (iVar5 == 3) {
      bVar3 = true;
      std::ifstream::close();
    }
    else {
      bVar3 = false;
    }
  }
  std::ifstream::~ifstream(local_238);
  return bVar3;
}

Assistant:

bool loadArchive(const char * fname, Issues & issues) {
    issues.clear();

    std::ifstream fin(fname);
    if (!fin.good()) return false;

    int curIssueId = 0;

    while (true) {
        std::string line;
        std::getline(fin, line);
        if (fin.eof()) break;

        std::vector<int> arr;
        std::istringstream iss(line);
        while (true) {
            int a;
            if (iss.eof()) break;
            iss >> a;
            arr.push_back(a);
        }

        int n = arr.size();
        if (n != 8 && n != 14 && n != 20 && n != 26) {
            fprintf(stderr, "Unexpected number of integers in archive line: %d\n", n);
            return false;
        }

        Issue issue;
        issue.id = curIssueId;
        issue.year = arr[0];
        issue.idYear = arr[1];

        int ndraws = (n - 2)/6;
        for (int i = 0; i < ndraws; ++i) {
            Draw draw;
            draw.id = i;
            draw.nums[0] = arr[2 + i*6 + 0];
            draw.nums[1] = arr[2 + i*6 + 1];
            draw.nums[2] = arr[2 + i*6 + 2];
            draw.nums[3] = arr[2 + i*6 + 3];
            draw.nums[4] = arr[2 + i*6 + 4];
            draw.nums[5] = arr[2 + i*6 + 5];

            issue.draws.emplace_back(std::move(draw));
        }

        issues.emplace_back(std::move(issue));

        ++curIssueId;
    }

    fin.close();

    return true;
}